

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

void spvc_msl_vertex_attribute_init(spvc_msl_vertex_attribute *attr)

{
  undefined1 local_28 [8];
  MSLShaderInterfaceVariable attr_default;
  spvc_msl_vertex_attribute *attr_local;
  
  attr_default._16_8_ = attr;
  spirv_cross::MSLShaderInterfaceVariable::MSLShaderInterfaceVariable
            ((MSLShaderInterfaceVariable *)local_28);
  *(undefined4 *)attr_default._16_8_ = local_28._0_4_;
  *(uint32_t *)(attr_default._16_8_ + 0x14) = attr_default.location;
  *(uint32_t *)(attr_default._16_8_ + 0x18) = attr_default.component;
  return;
}

Assistant:

void spvc_msl_vertex_attribute_init(spvc_msl_vertex_attribute *attr)
{
#if SPIRV_CROSS_C_API_MSL
	// Crude, but works.
	MSLShaderInterfaceVariable attr_default;
	attr->location = attr_default.location;
	attr->format = static_cast<spvc_msl_vertex_format>(attr_default.format);
	attr->builtin = static_cast<SpvBuiltIn>(attr_default.builtin);
#else
	memset(attr, 0, sizeof(*attr));
#endif
}